

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O2

blargg_err_t __thiscall Vgm_File::load_(Vgm_File *this,Data_Reader *in)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t n;
  blargg_err_t pcVar4;
  undefined4 extraout_var_03;
  uint uVar5;
  long remain;
  byte_ gd3_h [12];
  
  iVar1 = (*in->_vptr_Data_Reader[4])(in);
  if (CONCAT44(extraout_var,iVar1) < 0x41) {
    pcVar3 = "Wrong file type for this emulator";
  }
  else {
    iVar2 = (*in->_vptr_Data_Reader[3])(in,&this->h,0x40);
    pcVar3 = (char *)CONCAT44(extraout_var_00,iVar2);
    if ((pcVar3 == (blargg_err_t)0x0) &&
       (pcVar3 = check_vgm_header(&this->h), pcVar3 == (blargg_err_t)0x0)) {
      uVar5 = *(int *)(this->h).gd3_offset - 0x2c;
      if ((uVar5 != 0) &&
         (remain = (CONCAT44(extraout_var,iVar1) - (ulong)uVar5) + -0x40, 0xb < remain)) {
        iVar1 = (*in->_vptr_Data_Reader[5])(in);
        if ((blargg_err_t)CONCAT44(extraout_var_01,iVar1) != (blargg_err_t)0x0) {
          return (blargg_err_t)CONCAT44(extraout_var_01,iVar1);
        }
        iVar1 = (*in->_vptr_Data_Reader[3])(in,gd3_h,0xc);
        if ((blargg_err_t)CONCAT44(extraout_var_02,iVar1) != (blargg_err_t)0x0) {
          return (blargg_err_t)CONCAT44(extraout_var_02,iVar1);
        }
        n = check_gd3_header(gd3_h,remain);
        if (n != 0) {
          pcVar4 = blargg_vector<unsigned_char>::resize(&this->gd3,n);
          if (pcVar4 != (blargg_err_t)0x0) {
            return pcVar4;
          }
          iVar1 = (*in->_vptr_Data_Reader[3])(in,(this->gd3).begin_,(this->gd3).size_);
          if ((blargg_err_t)CONCAT44(extraout_var_03,iVar1) != (blargg_err_t)0x0) {
            return (blargg_err_t)CONCAT44(extraout_var_03,iVar1);
          }
        }
      }
      pcVar3 = (blargg_err_t)0x0;
    }
  }
  return pcVar3;
}

Assistant:

blargg_err_t load_( Data_Reader& in )
	{
		long file_size = in.remain();
		if ( file_size <= Vgm_Emu::header_size )
			return gme_wrong_file_type;
		
		RETURN_ERR( in.read( &h, Vgm_Emu::header_size ) );
		RETURN_ERR( check_vgm_header( h ) );
		
		long gd3_offset = get_le32( h.gd3_offset ) - 0x2C;
		long remain = file_size - Vgm_Emu::header_size - gd3_offset;
		byte gd3_h [gd3_header_size];
		if ( gd3_offset > 0 && remain >= gd3_header_size )
		{
			RETURN_ERR( in.skip( gd3_offset ) );
			RETURN_ERR( in.read( gd3_h, sizeof gd3_h ) );
			long gd3_size = check_gd3_header( gd3_h, remain );
			if ( gd3_size )
			{
				RETURN_ERR( gd3.resize( gd3_size ) );
				RETURN_ERR( in.read( gd3.begin(), (long)gd3.size() ) );
			}
		}
		return 0;
	}